

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::DoubleParameter::DoubleParameter(DoubleParameter *this,DoubleParameter *from)

{
  ulong uVar1;
  DoubleRange *this_00;
  undefined1 *from_00;
  Arena *arena;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DoubleParameter_0048e768;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  this->defaultvalue_ = from->defaultvalue_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 10) {
    clear_AllowedValues(this);
    this->_oneof_case_[0] = 10;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::DoubleRange>(arena)
    ;
    (this->AllowedValues_).range_ = this_00;
    if (from->_oneof_case_[0] == 10) {
      from_00 = (undefined1 *)(from->AllowedValues_).range_;
    }
    else {
      from_00 = _DoubleRange_default_instance_;
    }
    DoubleRange::MergeFrom(this_00,(DoubleRange *)from_00);
  }
  return;
}

Assistant:

DoubleParameter::DoubleParameter(const DoubleParameter& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  defaultvalue_ = from.defaultvalue_;
  clear_has_AllowedValues();
  switch (from.AllowedValues_case()) {
    case kRange: {
      _internal_mutable_range()->::CoreML::Specification::DoubleRange::MergeFrom(from._internal_range());
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.DoubleParameter)
}